

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O2

void __thiscall testing::internal::DeathTestImpl::~DeathTestImpl(DeathTestImpl *this)

{
  bool bVar1;
  undefined8 extraout_RAX;
  allocator<char> local_ed;
  int local_ec;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  (this->super_DeathTest)._vptr_DeathTest = (_func_int **)&PTR__DeathTestImpl_00179600;
  do {
    bVar1 = IsTrue(this->read_fd_ == -1);
    if (!bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c8,"CHECK failed: File ",&local_ed);
      std::operator+(&local_a8,&local_c8,
                     "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/contrib/gtest-1.7.0/src/gtest-death-test.cc"
                    );
      std::operator+(&local_88,&local_a8,", line ");
      local_ec = 0x176;
      StreamableToString<int>(&local_e8,&local_ec);
      std::operator+(&local_68,&local_88,&local_e8);
      std::operator+(&local_48,&local_68,": ");
      std::operator+(&local_28,&local_48,"read_fd_ == -1");
      DeathTestAbort(&local_28);
      __clang_call_terminate(extraout_RAX);
    }
    bVar1 = AlwaysFalse();
  } while (bVar1);
  return;
}

Assistant:

~DeathTestImpl() { GTEST_DEATH_TEST_CHECK_(read_fd_ == -1); }